

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  size_t sVar2;
  Colour colourGuard;
  char local_21;
  
  poVar1 = (ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam00000000001a3f30 = 0x2d2d2d2d2d2d2d;
    uRam00000000001a3f37._0_1_ = '-';
    uRam00000000001a3f37._1_1_ = '-';
    uRam00000000001a3f37._2_1_ = '-';
    uRam00000000001a3f37._3_1_ = '-';
    uRam00000000001a3f37._4_1_ = '-';
    uRam00000000001a3f37._5_1_ = '-';
    uRam00000000001a3f37._6_1_ = '-';
    uRam00000000001a3f37._7_1_ = '-';
    DAT_001a3f20 = '-';
    DAT_001a3f20_1._0_1_ = '-';
    DAT_001a3f20_1._1_1_ = '-';
    DAT_001a3f20_1._2_1_ = '-';
    DAT_001a3f20_1._3_1_ = '-';
    DAT_001a3f20_1._4_1_ = '-';
    DAT_001a3f20_1._5_1_ = '-';
    DAT_001a3f20_1._6_1_ = '-';
    uRam00000000001a3f28 = 0x2d2d2d2d2d2d2d;
    DAT_001a3f2f = 0x2d;
    DAT_001a3f10 = '-';
    DAT_001a3f10_1._0_1_ = '-';
    DAT_001a3f10_1._1_1_ = '-';
    DAT_001a3f10_1._2_1_ = '-';
    DAT_001a3f10_1._3_1_ = '-';
    DAT_001a3f10_1._4_1_ = '-';
    DAT_001a3f10_1._5_1_ = '-';
    DAT_001a3f10_1._6_1_ = '-';
    uRam00000000001a3f18._0_1_ = '-';
    uRam00000000001a3f18._1_1_ = '-';
    uRam00000000001a3f18._2_1_ = '-';
    uRam00000000001a3f18._3_1_ = '-';
    uRam00000000001a3f18._4_1_ = '-';
    uRam00000000001a3f18._5_1_ = '-';
    uRam00000000001a3f18._6_1_ = '-';
    uRam00000000001a3f18._7_1_ = '-';
    DAT_001a3f00 = '-';
    DAT_001a3f00_1._0_1_ = '-';
    DAT_001a3f00_1._1_1_ = '-';
    DAT_001a3f00_1._2_1_ = '-';
    DAT_001a3f00_1._3_1_ = '-';
    DAT_001a3f00_1._4_1_ = '-';
    DAT_001a3f00_1._5_1_ = '-';
    DAT_001a3f00_1._6_1_ = '-';
    uRam00000000001a3f08._0_1_ = '-';
    uRam00000000001a3f08._1_1_ = '-';
    uRam00000000001a3f08._2_1_ = '-';
    uRam00000000001a3f08._3_1_ = '-';
    uRam00000000001a3f08._4_1_ = '-';
    uRam00000000001a3f08._5_1_ = '-';
    uRam00000000001a3f08._6_1_ = '-';
    uRam00000000001a3f08._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam00000000001a3ef8._0_1_ = '-';
    uRam00000000001a3ef8._1_1_ = '-';
    uRam00000000001a3ef8._2_1_ = '-';
    uRam00000000001a3ef8._3_1_ = '-';
    uRam00000000001a3ef8._4_1_ = '-';
    uRam00000000001a3ef8._5_1_ = '-';
    uRam00000000001a3ef8._6_1_ = '-';
    uRam00000000001a3ef8._7_1_ = '-';
    DAT_001a3f3f = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)45>()::line,sVar2)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_21,1);
  Colour::use(Headers);
  printHeaderString(this,_name,0);
  Colour::use(None);
  return;
}

Assistant:

void ConsoleReporter::printOpenHeader(std::string const& _name) {
    stream << getLineOfChars<'-'>() << '\n';
    {
        Colour colourGuard(Colour::Headers);
        printHeaderString(_name);
    }
}